

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O2

tuple<int> __thiscall
testinator::Arbitrary<std::tuple<int>_>::generate
          (Arbitrary<std::tuple<int>_> *this,size_t n,unsigned_long randomSeed)

{
  int iVar1;
  TestRegistry *pTVar2;
  uniform_int_distribution<unsigned_long> dis;
  uniform_int_distribution<unsigned_long> local_30;
  
  pTVar2 = TestRegistry::Instance();
  ::std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&pTVar2->m_generator,randomSeed);
  local_30._M_param._M_a = 0;
  local_30._M_param._M_b = 0xffffffffffffffff;
  ::std::uniform_int_distribution<unsigned_long>::operator()(&local_30,&pTVar2->m_generator);
  iVar1 = detail::Arbitrary_Arithmetic<int>::generate(n,randomSeed);
  *(int *)this = iVar1;
  return (tuple<int>)SUB84(this,0);
}

Assistant:

static std::tuple<Ts...> generate(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate(n, r1),
                        Arbitrary<T>::generate(n, r2));
    }